

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

void __thiscall
QMdiSubWindowPrivate::_q_processFocusChanged(QMdiSubWindowPrivate *this,QWidget *old,QWidget *now)

{
  QWidget *this_00;
  bool bVar1;
  
  if (now == (QWidget *)0x0) {
    return;
  }
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  if (this_00 == now) {
    if (this->isInInteractiveMode == false) {
      setFocusWidget(this);
    }
  }
  else {
    bVar1 = QWidget::isAncestorOf(this_00,now);
    if (!bVar1) {
      return;
    }
  }
  setActive(this,true,true);
  return;
}

Assistant:

void QMdiSubWindowPrivate::_q_processFocusChanged(QWidget *old, QWidget *now)
{
    Q_UNUSED(old);
    Q_Q(QMdiSubWindow);
    if (now && (now == q || q->isAncestorOf(now))) {
        if (now == q && !isInInteractiveMode)
            setFocusWidget();
        setActive(true);
    }
}